

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::proper_arg_list(analysis *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  NodePtr *ret;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_in_ptr;
  TreeNode *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  analysis *local_78;
  string local_70;
  TreeNode *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  assignment_expr(this);
  local_88 = *(TreeNode **)this;
  local_80._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)local_80._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)local_80._M_pi)->upper_tab).
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_80._M_pi)->upper_tab).
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)local_80._M_pi)->upper_tab).
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_80._M_pi)->upper_tab).
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_78 = this;
  while( true ) {
    token::getVal_abi_cxx11_
              ((string *)&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    _Var2._M_pi = extraout_RDX;
    if (local_50 != (TreeNode *)&stack0xffffffffffffffc0) {
      operator_delete(local_50);
      _Var2._M_pi = extraout_RDX_00;
    }
    if (iVar1 != 0) break;
    local_70.field_2._M_allocated_capacity._0_2_ = 0x2c;
    local_70._M_string_length = 1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    match(in_RSI,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    assignment_expr((analysis *)&local_50);
    TreeNode::setSibling(local_88,(NodePtr *)&local_50);
    local_88 = local_50;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_80,&local_48);
    if ((element_type *)local_48._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
  }
  if ((element_type *)local_80._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::proper_arg_list()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in proper_arg_list\n";
#endif
	NodePtr ret = arg();

	NodePtr tmp_cur_ptr = ret;
	while(tmp->getVal() == ",")
	{
		match(",");
		NodePtr tmp_in_ptr = arg();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}

	return ret;
}